

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastAndEffectiveFeaturePreservingMeshDenoising.cpp
# Opt level: O2

void __thiscall
FastAndEffectiveFeaturePreservingMeshDenoising::denoise
          (FastAndEffectiveFeaturePreservingMeshDenoising *this)

{
  ParameterSet *this_00;
  bool bVar1;
  undefined1 local_280 [8];
  TriMesh mesh;
  undefined1 auStack_38 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  filtered_normals;
  int vertex_iteration_number;
  
  OpenMesh::TriMesh_ArrayKernelT<MyTraits>::TriMesh_ArrayKernelT
            ((TriMesh_ArrayKernelT<MyTraits> *)local_280,
             &((this->super_MeshDenoisingBase).data_manager_)->noisy_mesh_);
  if (mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _168_8_ !=
      mesh.super_Mesh.
      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
      .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>.
      _160_8_) {
    auStack_38 = (undefined1  [8])0x0;
    filtered_normals.
    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    filtered_normals.
    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (*(this->super_MeshDenoisingBase)._vptr_MeshDenoisingBase[2])(this,local_280);
    this_00 = (this->super_MeshDenoisingBase).parameter_set_;
    std::__cxx11::string::string
              ((string *)
               &mesh.super_Mesh.
                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                .
                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                .refcount_fcolors_,"Vertex Iteration Num.",
               (allocator *)
               ((long)&filtered_normals.
                       super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    bVar1 = ParameterSet::getValue
                      (this_00,(string *)
                               &mesh.super_Mesh.
                                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                .
                                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                .refcount_fcolors_,
                       (int *)&filtered_normals.
                               super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &mesh.super_Mesh.
                super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                .
                super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                .refcount_fcolors_);
    if (bVar1) {
      MeshDenoisingBase::updateVertexPosition
                (&this->super_MeshDenoisingBase,(TriMesh *)local_280,
                 (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  *)auStack_38,
                 (int)filtered_normals.
                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
      OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
      ::operator=((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   *)&((this->super_MeshDenoisingBase).data_manager_)->mesh_,
                  (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   *)local_280);
      OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
      ::operator=((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   *)&((this->super_MeshDenoisingBase).data_manager_)->denoised_mesh_,
                  (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   *)local_280);
    }
    std::_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
    ::~_Vector_base((_Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                     *)auStack_38);
  }
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)local_280);
  return;
}

Assistant:

void FastAndEffectiveFeaturePreservingMeshDenoising::denoise()
{
    // get data
    TriMesh mesh = data_manager_->getNoisyMesh();

    if(mesh.n_vertices() == 0)
        return;

    // update face normal
    std::vector<TriMesh::Normal> filtered_normals;
    updateFilteredNormals(mesh, filtered_normals);

    // get parameter for vertex update
    int vertex_iteration_number;
    if(!parameter_set_->getValue(string("Vertex Iteration Num."), vertex_iteration_number))
        return;

    // update vertex position
    updateVertexPosition(mesh, filtered_normals, vertex_iteration_number, true);

    // update data
    data_manager_->setMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}